

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  FILEPROTO *pFVar2;
  
  pFVar2 = (FILEPROTO *)(*Curl_ccalloc)(1,0x70);
  if (pFVar2 == (FILEPROTO *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    (data->req).p.file = pFVar2;
    Curl_conncontrol(conn,0);
    if (((data->state).httpwant == '\x1f') &&
       (CVar1 = Curl_conn_may_http3(data,conn), CVar1 != CURLE_OK)) {
      return CVar1;
    }
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  DEBUGASSERT(data->req.p.http == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  data->req.p.http = http;
  connkeep(conn, "HTTP default");

  if(data->state.httpwant == CURL_HTTP_VERSION_3ONLY) {
    CURLcode result = Curl_conn_may_http3(data, conn);
    if(result)
      return result;
  }

  return CURLE_OK;
}